

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg1.c
# Opt level: O3

keycode_t borg_inkey(_Bool take)

{
  keycode_t kVar1;
  short sVar2;
  bool bVar3;
  
  kVar1 = 0;
  if ((borg_key_head != borg_key_tail) && (kVar1 = borg_key_queue[borg_key_tail], take)) {
    sVar2 = borg_key_tail + 1;
    bVar3 = borg_key_tail != 0x1fff;
    borg_key_tail = 0;
    if (bVar3) {
      borg_key_tail = sVar2;
    }
  }
  return kVar1;
}

Assistant:

keycode_t borg_inkey(bool take)
{
    int i;

    /* Nothing ready */
    if (borg_key_head == borg_key_tail)
        return (0);

    /* Extract the keypress */
    i = borg_key_queue[borg_key_tail];

    /* Do not advance */
    if (!take)
        return (i);

    /* Advance the queue */
    borg_key_tail++;

    /* Circular queue requires wrap-around */
    if (borg_key_tail == KEY_SIZE)
        borg_key_tail = 0;

    /* Return the key */
    return (i);
}